

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int64_suite::fail_array8_int64_overflow(void)

{
  undefined4 local_5c;
  size_type local_58;
  array<long,_1UL> value;
  value_type input [18];
  decoder decoder;
  
  input[0] = 0xae;
  input[1] = '\x10';
  input[2] = '\x11';
  input[3] = '\"';
  input[4] = '3';
  input[5] = 'D';
  input[6] = 'U';
  input[7] = 'f';
  input[8] = 'w';
  input[9] = 0x88;
  input[10] = 0x99;
  input[0xb] = 0xaa;
  input[0xc] = 0xbb;
  input[0xd] = 0xcc;
  input[0xe] = 0xdd;
  input[0xf] = 0xee;
  input[0x10] = 0xff;
  input[0x11] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[18]>(&decoder,&input);
  value._M_elems[0] = (_Type)0;
  local_58 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::int64>::decode(&decoder,value._M_elems,1);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xae0,"void compact_int64_suite::fail_array8_int64_overflow()",&local_58,&local_5c);
  return;
}

Assistant:

void fail_array8_int64_overflow()
{
    const value_type input[] = { token::code::array8_int64, 0x10, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00 };
    format::detail::decoder decoder(input);
    std::array<std::int64_t, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}